

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O2

bool __thiscall DataSourceDOS::check(DataSourceDOS *this)

{
  int iVar1;
  Stream *pSVar2;
  bool bVar3;
  long lVar4;
  pointer pbVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_13b;
  allocator_type local_13a;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  pointer local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  default_file_names;
  undefined1 local_110 [32];
  string file_path;
  string file_name;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_name,"SPAE.PA",(allocator<char> *)&file_path);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"SPAF.PA",(allocator<char> *)local_110);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"SPAD.PA",&local_13b);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"SPAU.PA",&local_139);
  __l._M_len = 4;
  __l._M_array = &file_name;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&default_file_names,__l,&local_13a);
  lVar4 = 0x60;
  do {
    std::__cxx11::string::~string(local_b0 + lVar4 + -0x20);
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  local_138 = &(this->super_DataSourceLegacy).super_DataSourceBase.path;
  iVar1 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                    (this);
  bVar3 = true;
  if ((char)iVar1 == '\0') {
    local_130 = default_file_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = default_file_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != local_130;
        pbVar5 = pbVar5 + 1) {
      std::__cxx11::string::string((string *)&file_name,(string *)pbVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     local_138,'/');
      std::operator+(&file_path,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &file_name);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::string<std::allocator<char>>(local_50,"data",&local_13b);
      Log::Logger::operator[]((Logger *)local_110,(string *)&Log::Info);
      pSVar2 = Log::Stream::operator<<((Stream *)local_110,"Looking for game data in \'");
      pSVar2 = Log::Stream::operator<<(pSVar2,&file_path);
      Log::Stream::operator<<(pSVar2,"\'...");
      Log::Stream::~Stream((Stream *)local_110);
      std::__cxx11::string::~string(local_50);
      iVar1 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                        (this,&file_path);
      if ((char)iVar1 != '\0') {
        std::__cxx11::string::operator=((string *)local_138,(string *)&file_path);
        std::__cxx11::string::~string((string *)&file_path);
        std::__cxx11::string::~string((string *)&file_name);
        bVar3 = true;
        goto LAB_00126f73;
      }
      std::__cxx11::string::~string((string *)&file_path);
      std::__cxx11::string::~string((string *)&file_name);
    }
    bVar3 = false;
  }
LAB_00126f73:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&default_file_names);
  return bVar3;
}

Assistant:

bool
DataSourceDOS::check() {
  std::vector<std::string> default_file_names = {
    "SPAE.PA",  // English
    "SPAF.PA",  // French
    "SPAD.PA",  // German
    "SPAU.PA"   // Engish (US)
  };

  if (check_file(path)) {
    return true;
  }

  for (std::string file_name : default_file_names) {
    std::string file_path = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << file_path << "'...";
    if (check_file(file_path)) {
      path = std::move(file_path);
      return true;
    }
  }

  return false;
}